

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::Encode
          (RelativeWorldCoordinates *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16RefPnt);
  (*(this->m_DelX).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DelX,stream);
  (*(this->m_DelY).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DelY,stream);
  (*(this->m_DelZ).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DelZ,stream);
  return;
}

Assistant:

void RelativeWorldCoordinates::Encode( KDataStream & stream ) const
{
    stream << m_ui16RefPnt
           << KDIS_STREAM m_DelX
           << KDIS_STREAM m_DelY
           << KDIS_STREAM m_DelZ;
}